

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

bool DoGiveInventory(AActor *receiver,bool orresult,VMValue *param,
                    TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  _func_int **pp_Var2;
  PClass *pPVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  AInventory *this;
  undefined4 extraout_var_00;
  PClassActor *pPVar7;
  char *pcVar8;
  PClassActor *type;
  bool bVar9;
  bool bVar10;
  DVector3 local_48;
  PClass *pPVar6;
  
  if (numparam < 2) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003d0ce9;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003d0cd9:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d0ce9:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x944,
                  "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003d0b1b;
    pPVar7 = type;
    if (type != (PClassActor *)AInventory::RegistrationInfo.MyClass) {
      do {
        pPVar7 = (PClassActor *)(pPVar7->super_PClass).ParentClass;
        if (pPVar7 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
      } while (pPVar7 != (PClassActor *)0x0);
      if (pPVar7 == (PClassActor *)0x0) {
        pcVar8 = "mi == NULL || mi->IsDescendantOf(RUNTIME_CLASS(AInventory))";
        goto LAB_003d0ce9;
      }
    }
    bVar10 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003d0cd9;
LAB_003d0b1b:
    bVar10 = true;
    type = (PClassActor *)0x0;
  }
  if (numparam == 2) {
    if ((char)defaultparam[2].Count != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d0d11:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x945,
                    "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar5 = *(int *)&defaultparam[2].Array;
    if (orresult) goto LAB_003d0b82;
LAB_003d0b6a:
    if ((char)defaultparam[3].Count != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d0d30:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x949,
                    "bool DoGiveInventory(AActor *, bool, VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d0d11;
    }
    iVar5 = param[2].field_0.i;
    if (orresult) goto LAB_003d0b82;
    if (numparam < 4) goto LAB_003d0b6a;
    defaultparam = (TArray<VMValue,_VMValue> *)param;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d0d30;
    }
  }
  receiver = COPY_AAPTR(receiver,*(int *)&defaultparam[3].Array);
LAB_003d0b82:
  pPVar3 = AInventory::RegistrationInfo.MyClass;
  if (receiver != (AActor *)0x0) {
    pPVar6 = (receiver->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(receiver->super_DThinker).super_DObject._vptr_DObject)(receiver);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (receiver->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar9 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar3 && bVar9) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if ((bVar9) &&
       (pp_Var2 = receiver[1].super_DThinker.super_DObject._vptr_DObject,
       pp_Var2 != (_func_int **)0x0)) {
      if (((ulong)pp_Var2[4] & 0x20) == 0) {
        return false;
      }
      receiver[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
    }
    iVar4 = 1;
    if (1 < iVar5) {
      iVar4 = iVar5;
    }
    if (!bVar10) {
      local_48.X = 0.0;
      local_48.Y = 0.0;
      local_48.Z = 0.0;
      this = (AInventory *)AActor::StaticSpawn(type,&local_48,NO_REPLACE,false);
      pPVar3 = AHealth::RegistrationInfo.MyClass;
      if (this == (AInventory *)0x0) {
        return false;
      }
      pPVar6 = (this->super_AActor).super_DThinker.super_DObject.Class;
      if (pPVar6 == (PClass *)0x0) {
        iVar5 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
        pPVar6 = (PClass *)CONCAT44(extraout_var_00,iVar5);
        (this->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
      }
      bVar10 = pPVar6 != (PClass *)0x0;
      if (pPVar6 != pPVar3 && bVar10) {
        do {
          pPVar6 = pPVar6->ParentClass;
          bVar10 = pPVar6 != (PClass *)0x0;
          if (pPVar6 == pPVar3) break;
        } while (pPVar6 != (PClass *)0x0);
      }
      if (bVar10) {
        iVar4 = iVar4 * this->Amount;
      }
      this->Amount = iVar4;
      pbVar1 = (byte *)((long)&(this->super_AActor).flags.Value + 2);
      *pbVar1 = *pbVar1 | 2;
      AActor::ClearCounters((AActor *)this);
      bVar10 = AInventory::CallTryPickup(this,receiver,(AActor **)0x0);
      if (bVar10) {
        return true;
      }
      (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this);
    }
  }
  return false;
}

Assistant:

static bool DoGiveInventory(AActor *receiver, bool orresult, VM_ARGS)
{
	int paramnum = 0;
	PARAM_CLASS		(mi, AInventory);
	PARAM_INT_DEF	(amount)

	if (!orresult)
	{
		PARAM_INT_DEF(setreceiver)
		receiver = COPY_AAPTR(receiver, setreceiver);
	}
	if (receiver == NULL)
	{ // If there's nothing to receive it, it's obviously a fail, right?
		return false;
	}
	// Owned inventory items cannot own anything because their Inventory pointer is repurposed for the owner's linked list.
	if (receiver->IsKindOf(RUNTIME_CLASS(AInventory)) && static_cast<AInventory*>(receiver)->Owner != nullptr)
	{
		return false;
	}

	if (amount <= 0)
	{
		amount = 1;
	}
	if (mi) 
	{
		AInventory *item = static_cast<AInventory *>(Spawn(mi));
		if (item == NULL)
		{
			return false;
		}
		if (item->IsKindOf(RUNTIME_CLASS(AHealth)))
		{
			item->Amount *= amount;
		}
		else
		{
			item->Amount = amount;
		}
		item->flags |= MF_DROPPED;
		item->ClearCounters();
		if (!item->CallTryPickup(receiver))
		{
			item->Destroy();
			return false;
		}
		else
		{
			return true;
		}
	}
	return false;
}